

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_102>::invoke
          (TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_102> *this)

{
  code *local_3c0;
  undefined1 local_390 [8];
  C_A_T_C_H_T_E_S_T_102 obj;
  TestInvokerAsMethod<(anonymous_namespace)::C_A_T_C_H_T_E_S_T_102> *this_local;
  
  obj.super_TApp.args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  anon_unknown.dwarf_3e2c8::C_A_T_C_H_T_E_S_T_102::C_A_T_C_H_T_E_S_T_102
            ((C_A_T_C_H_T_E_S_T_102 *)local_390);
  local_3c0 = (code *)this->m_testAsMethod;
  if (((ulong)local_3c0 & 1) != 0) {
    local_3c0 = *(code **)(local_3c0 + *(long *)(local_390 + *(long *)&this->field_0x10) + -1);
  }
  (*local_3c0)(local_390 + *(long *)&this->field_0x10);
  anon_unknown.dwarf_3e2c8::C_A_T_C_H_T_E_S_T_102::~C_A_T_C_H_T_E_S_T_102
            ((C_A_T_C_H_T_E_S_T_102 *)local_390);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }